

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

TextureBindingSp __thiscall
vkt::sr::anon_unknown_0::createEmptyTexture
          (anon_unknown_0 *this,deUint32 format,TextureType type,IVec3 *textureSize,int numLevels,
          int lodBase,Sampler *sampler)

{
  int *piVar1;
  long *plVar2;
  long lVar3;
  TextureCube *pTVar4;
  TextureBinding *pTVar5;
  long *plVar6;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  SharedPtrStateBase *extraout_RDX_01;
  SharedPtrStateBase *extraout_RDX_02;
  SharedPtrStateBase *extraout_RDX_03;
  SharedPtrStateBase *extraout_RDX_04;
  SharedPtrStateBase *extraout_RDX_05;
  SharedPtrStateBase *extraout_RDX_06;
  SharedPtrStateBase *pSVar7;
  int iVar8;
  int face;
  CubeFace face_00;
  TextureBindingSp TVar9;
  MovePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> texture;
  TextureFormat texFmt;
  UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> local_48;
  TextureFormat local_38;
  
  local_38 = glu::mapGLInternalFormat(format);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  pSVar7 = extraout_RDX;
  switch(type) {
  case TEXTURETYPE_1D:
    pTVar4 = (TextureCube *)operator_new(0x50);
    tcu::Texture1D::Texture1D((Texture1D *)pTVar4,&local_38,textureSize->m_data[0]);
    local_48.m_data.ptr = pTVar4;
    if (0 < numLevels) {
      iVar8 = 0;
      do {
        tcu::Texture1D::allocLevel((Texture1D *)local_48.m_data.ptr,iVar8);
        iVar8 = iVar8 + 1;
      } while (numLevels != iVar8);
    }
    pTVar5 = (TextureBinding *)operator_new(0x68);
    pTVar4 = local_48.m_data.ptr;
    local_48.m_data.ptr = (TextureCube *)0x0;
    TextureBinding::TextureBinding(pTVar5,(Texture1D *)pTVar4,sampler);
    plVar6 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar6 + 1) = 0;
    *(undefined4 *)((long)plVar6 + 0xc) = 0;
    *plVar6 = (long)&PTR__SharedPtrState_00d5ad08;
    plVar6[2] = (long)pTVar5;
    *(undefined4 *)(plVar6 + 1) = 1;
    *(undefined4 *)((long)plVar6 + 0xc) = 1;
    plVar2 = *(long **)(this + 8);
    if (plVar2 != plVar6) {
      if (plVar2 != (long *)0x0) {
        LOCK();
        plVar2 = plVar2 + 1;
        *(int *)plVar2 = (int)*plVar2 + -1;
        UNLOCK();
        if ((int)*plVar2 == 0) {
          *(undefined8 *)this = 0;
          (**(code **)(**(long **)(this + 8) + 0x10))();
        }
        LOCK();
        piVar1 = (int *)(*(long *)(this + 8) + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (*(long **)(this + 8) != (long *)0x0) {
            (**(code **)(**(long **)(this + 8) + 8))();
          }
          *(undefined8 *)(this + 8) = 0;
        }
      }
      *(TextureBinding **)this = pTVar5;
      *(long **)(this + 8) = plVar6;
      LOCK();
      *(int *)(plVar6 + 1) = (int)plVar6[1] + 1;
      UNLOCK();
      LOCK();
      *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
      UNLOCK();
    }
    LOCK();
    plVar2 = plVar6 + 1;
    *(int *)plVar2 = (int)*plVar2 + -1;
    UNLOCK();
    if ((int)*plVar2 == 0) {
      (**(code **)(*plVar6 + 0x10))(plVar6);
    }
    LOCK();
    piVar1 = (int *)((long)plVar6 + 0xc);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**(code **)(*plVar6 + 8))(plVar6);
    }
    de::details::UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::reset
              ((UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *)&local_48);
    pSVar7 = extraout_RDX_00;
    break;
  case TEXTURETYPE_2D:
    pTVar4 = (TextureCube *)operator_new(0x50);
    tcu::Texture2D::Texture2D
              ((Texture2D *)pTVar4,&local_38,textureSize->m_data[0],textureSize->m_data[1]);
    local_48.m_data.ptr = pTVar4;
    if (0 < numLevels) {
      iVar8 = 0;
      do {
        tcu::Texture2D::allocLevel((Texture2D *)local_48.m_data.ptr,iVar8);
        iVar8 = iVar8 + 1;
      } while (numLevels != iVar8);
    }
    pTVar5 = (TextureBinding *)operator_new(0x68);
    pTVar4 = local_48.m_data.ptr;
    local_48.m_data.ptr = (TextureCube *)0x0;
    TextureBinding::TextureBinding(pTVar5,(Texture2D *)pTVar4,sampler);
    plVar6 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar6 + 1) = 0;
    *(undefined4 *)((long)plVar6 + 0xc) = 0;
    *plVar6 = (long)&PTR__SharedPtrState_00d5ad08;
    plVar6[2] = (long)pTVar5;
    *(undefined4 *)(plVar6 + 1) = 1;
    *(undefined4 *)((long)plVar6 + 0xc) = 1;
    plVar2 = *(long **)(this + 8);
    if (plVar2 != plVar6) {
      if (plVar2 != (long *)0x0) {
        LOCK();
        plVar2 = plVar2 + 1;
        *(int *)plVar2 = (int)*plVar2 + -1;
        UNLOCK();
        if ((int)*plVar2 == 0) {
          *(undefined8 *)this = 0;
          (**(code **)(**(long **)(this + 8) + 0x10))();
        }
        LOCK();
        piVar1 = (int *)(*(long *)(this + 8) + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (*(long **)(this + 8) != (long *)0x0) {
            (**(code **)(**(long **)(this + 8) + 8))();
          }
          *(undefined8 *)(this + 8) = 0;
        }
      }
      *(TextureBinding **)this = pTVar5;
      *(long **)(this + 8) = plVar6;
      LOCK();
      *(int *)(plVar6 + 1) = (int)plVar6[1] + 1;
      UNLOCK();
      LOCK();
      *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
      UNLOCK();
    }
    LOCK();
    plVar2 = plVar6 + 1;
    *(int *)plVar2 = (int)*plVar2 + -1;
    UNLOCK();
    if ((int)*plVar2 == 0) {
      (**(code **)(*plVar6 + 0x10))(plVar6);
    }
    LOCK();
    piVar1 = (int *)((long)plVar6 + 0xc);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**(code **)(*plVar6 + 8))(plVar6);
    }
    de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::reset
              ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&local_48);
    pSVar7 = extraout_RDX_04;
    break;
  case TEXTURETYPE_3D:
    pTVar4 = (TextureCube *)operator_new(0x58);
    tcu::Texture3D::Texture3D
              ((Texture3D *)pTVar4,&local_38,textureSize->m_data[0],textureSize->m_data[1],
               textureSize->m_data[2]);
    local_48.m_data.ptr = pTVar4;
    if (0 < numLevels) {
      iVar8 = 0;
      do {
        tcu::Texture3D::allocLevel((Texture3D *)local_48.m_data.ptr,iVar8);
        iVar8 = iVar8 + 1;
      } while (numLevels != iVar8);
    }
    pTVar5 = (TextureBinding *)operator_new(0x68);
    pTVar4 = local_48.m_data.ptr;
    local_48.m_data.ptr = (TextureCube *)0x0;
    TextureBinding::TextureBinding(pTVar5,(Texture3D *)pTVar4,sampler);
    plVar6 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar6 + 1) = 0;
    *(undefined4 *)((long)plVar6 + 0xc) = 0;
    *plVar6 = (long)&PTR__SharedPtrState_00d5ad08;
    plVar6[2] = (long)pTVar5;
    *(undefined4 *)(plVar6 + 1) = 1;
    *(undefined4 *)((long)plVar6 + 0xc) = 1;
    plVar2 = *(long **)(this + 8);
    if (plVar2 != plVar6) {
      if (plVar2 != (long *)0x0) {
        LOCK();
        plVar2 = plVar2 + 1;
        *(int *)plVar2 = (int)*plVar2 + -1;
        UNLOCK();
        if ((int)*plVar2 == 0) {
          *(undefined8 *)this = 0;
          (**(code **)(**(long **)(this + 8) + 0x10))();
        }
        LOCK();
        piVar1 = (int *)(*(long *)(this + 8) + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (*(long **)(this + 8) != (long *)0x0) {
            (**(code **)(**(long **)(this + 8) + 8))();
          }
          *(undefined8 *)(this + 8) = 0;
        }
      }
      *(TextureBinding **)this = pTVar5;
      *(long **)(this + 8) = plVar6;
      LOCK();
      *(int *)(plVar6 + 1) = (int)plVar6[1] + 1;
      UNLOCK();
      LOCK();
      *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
      UNLOCK();
    }
    LOCK();
    plVar2 = plVar6 + 1;
    *(int *)plVar2 = (int)*plVar2 + -1;
    UNLOCK();
    if ((int)*plVar2 == 0) {
      (**(code **)(*plVar6 + 0x10))(plVar6);
    }
    LOCK();
    piVar1 = (int *)((long)plVar6 + 0xc);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**(code **)(*plVar6 + 8))(plVar6);
    }
    de::details::UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>::reset
              ((UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> *)&local_48);
    pSVar7 = extraout_RDX_02;
    break;
  case TEXTURETYPE_CUBE_MAP:
    pTVar4 = (TextureCube *)operator_new(0x168);
    tcu::TextureCube::TextureCube(pTVar4,&local_38,textureSize->m_data[0]);
    local_48.m_data.ptr = pTVar4;
    if (0 < numLevels) {
      iVar8 = 0;
      do {
        face_00 = CUBEFACE_NEGATIVE_X;
        do {
          tcu::TextureCube::allocLevel(local_48.m_data.ptr,face_00,iVar8);
          face_00 = face_00 + CUBEFACE_POSITIVE_X;
        } while (face_00 != CUBEFACE_LAST);
        iVar8 = iVar8 + 1;
      } while (iVar8 != numLevels);
    }
    pTVar5 = (TextureBinding *)operator_new(0x68);
    pTVar4 = local_48.m_data.ptr;
    local_48.m_data.ptr = (TextureCube *)0x0;
    TextureBinding::TextureBinding(pTVar5,pTVar4,sampler);
    plVar6 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar6 + 1) = 0;
    *(undefined4 *)((long)plVar6 + 0xc) = 0;
    *plVar6 = (long)&PTR__SharedPtrState_00d5ad08;
    plVar6[2] = (long)pTVar5;
    *(undefined4 *)(plVar6 + 1) = 1;
    *(undefined4 *)((long)plVar6 + 0xc) = 1;
    plVar2 = *(long **)(this + 8);
    if (plVar2 != plVar6) {
      if (plVar2 != (long *)0x0) {
        LOCK();
        plVar2 = plVar2 + 1;
        *(int *)plVar2 = (int)*plVar2 + -1;
        UNLOCK();
        if ((int)*plVar2 == 0) {
          *(undefined8 *)this = 0;
          (**(code **)(**(long **)(this + 8) + 0x10))();
        }
        LOCK();
        piVar1 = (int *)(*(long *)(this + 8) + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (*(long **)(this + 8) != (long *)0x0) {
            (**(code **)(**(long **)(this + 8) + 8))();
          }
          *(undefined8 *)(this + 8) = 0;
        }
      }
      *(TextureBinding **)this = pTVar5;
      *(long **)(this + 8) = plVar6;
      LOCK();
      *(int *)(plVar6 + 1) = (int)plVar6[1] + 1;
      UNLOCK();
      LOCK();
      *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
      UNLOCK();
    }
    LOCK();
    plVar2 = plVar6 + 1;
    *(int *)plVar2 = (int)*plVar2 + -1;
    UNLOCK();
    if ((int)*plVar2 == 0) {
      (**(code **)(*plVar6 + 0x10))(plVar6);
    }
    LOCK();
    piVar1 = (int *)((long)plVar6 + 0xc);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**(code **)(*plVar6 + 8))(plVar6);
    }
    de::details::UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::reset
              (&local_48);
    pSVar7 = extraout_RDX_03;
    break;
  case TEXTURETYPE_1D_ARRAY:
    pTVar4 = (TextureCube *)operator_new(0x50);
    tcu::Texture1DArray::Texture1DArray
              ((Texture1DArray *)pTVar4,&local_38,textureSize->m_data[0],textureSize->m_data[2]);
    local_48.m_data.ptr = pTVar4;
    if (0 < numLevels) {
      iVar8 = 0;
      do {
        tcu::Texture1DArray::allocLevel((Texture1DArray *)local_48.m_data.ptr,iVar8);
        iVar8 = iVar8 + 1;
      } while (numLevels != iVar8);
    }
    pTVar5 = (TextureBinding *)operator_new(0x68);
    pTVar4 = local_48.m_data.ptr;
    local_48.m_data.ptr = (TextureCube *)0x0;
    TextureBinding::TextureBinding(pTVar5,(Texture1DArray *)pTVar4,sampler);
    plVar6 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar6 + 1) = 0;
    *(undefined4 *)((long)plVar6 + 0xc) = 0;
    *plVar6 = (long)&PTR__SharedPtrState_00d5ad08;
    plVar6[2] = (long)pTVar5;
    *(undefined4 *)(plVar6 + 1) = 1;
    *(undefined4 *)((long)plVar6 + 0xc) = 1;
    plVar2 = *(long **)(this + 8);
    if (plVar2 != plVar6) {
      if (plVar2 != (long *)0x0) {
        LOCK();
        plVar2 = plVar2 + 1;
        *(int *)plVar2 = (int)*plVar2 + -1;
        UNLOCK();
        if ((int)*plVar2 == 0) {
          *(undefined8 *)this = 0;
          (**(code **)(**(long **)(this + 8) + 0x10))();
        }
        LOCK();
        piVar1 = (int *)(*(long *)(this + 8) + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (*(long **)(this + 8) != (long *)0x0) {
            (**(code **)(**(long **)(this + 8) + 8))();
          }
          *(undefined8 *)(this + 8) = 0;
        }
      }
      *(TextureBinding **)this = pTVar5;
      *(long **)(this + 8) = plVar6;
      LOCK();
      *(int *)(plVar6 + 1) = (int)plVar6[1] + 1;
      UNLOCK();
      LOCK();
      *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
      UNLOCK();
    }
    LOCK();
    plVar2 = plVar6 + 1;
    *(int *)plVar2 = (int)*plVar2 + -1;
    UNLOCK();
    if ((int)*plVar2 == 0) {
      (**(code **)(*plVar6 + 0x10))(plVar6);
    }
    LOCK();
    piVar1 = (int *)((long)plVar6 + 0xc);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**(code **)(*plVar6 + 8))(plVar6);
    }
    de::details::UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>::reset
              ((UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_> *)
               &local_48);
    pSVar7 = extraout_RDX_01;
    break;
  case TEXTURETYPE_2D_ARRAY:
    pTVar4 = (TextureCube *)operator_new(0x58);
    tcu::Texture2DArray::Texture2DArray
              ((Texture2DArray *)pTVar4,&local_38,textureSize->m_data[0],textureSize->m_data[1],
               textureSize->m_data[2]);
    local_48.m_data.ptr = pTVar4;
    if (0 < numLevels) {
      iVar8 = 0;
      do {
        tcu::Texture2DArray::allocLevel((Texture2DArray *)local_48.m_data.ptr,iVar8);
        iVar8 = iVar8 + 1;
      } while (numLevels != iVar8);
    }
    pTVar5 = (TextureBinding *)operator_new(0x68);
    pTVar4 = local_48.m_data.ptr;
    local_48.m_data.ptr = (TextureCube *)0x0;
    TextureBinding::TextureBinding(pTVar5,(Texture2DArray *)pTVar4,sampler);
    plVar6 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar6 + 1) = 0;
    *(undefined4 *)((long)plVar6 + 0xc) = 0;
    *plVar6 = (long)&PTR__SharedPtrState_00d5ad08;
    plVar6[2] = (long)pTVar5;
    *(undefined4 *)(plVar6 + 1) = 1;
    *(undefined4 *)((long)plVar6 + 0xc) = 1;
    plVar2 = *(long **)(this + 8);
    if (plVar2 != plVar6) {
      if (plVar2 != (long *)0x0) {
        LOCK();
        plVar2 = plVar2 + 1;
        *(int *)plVar2 = (int)*plVar2 + -1;
        UNLOCK();
        if ((int)*plVar2 == 0) {
          *(undefined8 *)this = 0;
          (**(code **)(**(long **)(this + 8) + 0x10))();
        }
        LOCK();
        piVar1 = (int *)(*(long *)(this + 8) + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (*(long **)(this + 8) != (long *)0x0) {
            (**(code **)(**(long **)(this + 8) + 8))();
          }
          *(undefined8 *)(this + 8) = 0;
        }
      }
      *(TextureBinding **)this = pTVar5;
      *(long **)(this + 8) = plVar6;
      LOCK();
      *(int *)(plVar6 + 1) = (int)plVar6[1] + 1;
      UNLOCK();
      LOCK();
      *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
      UNLOCK();
    }
    LOCK();
    plVar2 = plVar6 + 1;
    *(int *)plVar2 = (int)*plVar2 + -1;
    UNLOCK();
    if ((int)*plVar2 == 0) {
      (**(code **)(*plVar6 + 0x10))(plVar6);
    }
    LOCK();
    piVar1 = (int *)((long)plVar6 + 0xc);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**(code **)(*plVar6 + 8))(plVar6);
    }
    de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::reset
              ((UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)
               &local_48);
    pSVar7 = extraout_RDX_05;
    break;
  case TEXTURETYPE_CUBE_ARRAY:
    pTVar4 = (TextureCube *)operator_new(0x50);
    tcu::TextureCubeArray::TextureCubeArray
              ((TextureCubeArray *)pTVar4,&local_38,textureSize->m_data[0],textureSize->m_data[2]);
    local_48.m_data.ptr = pTVar4;
    if (0 < numLevels) {
      iVar8 = 0;
      do {
        tcu::TextureCubeArray::allocLevel((TextureCubeArray *)local_48.m_data.ptr,iVar8);
        iVar8 = iVar8 + 1;
      } while (numLevels != iVar8);
    }
    pTVar5 = (TextureBinding *)operator_new(0x68);
    pTVar4 = local_48.m_data.ptr;
    local_48.m_data.ptr = (TextureCube *)0x0;
    TextureBinding::TextureBinding(pTVar5,(TextureCubeArray *)pTVar4,sampler);
    plVar6 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar6 + 1) = 0;
    *(undefined4 *)((long)plVar6 + 0xc) = 0;
    *plVar6 = (long)&PTR__SharedPtrState_00d5ad08;
    plVar6[2] = (long)pTVar5;
    *(undefined4 *)(plVar6 + 1) = 1;
    *(undefined4 *)((long)plVar6 + 0xc) = 1;
    plVar2 = *(long **)(this + 8);
    if (plVar2 != plVar6) {
      if (plVar2 != (long *)0x0) {
        LOCK();
        plVar2 = plVar2 + 1;
        *(int *)plVar2 = (int)*plVar2 + -1;
        UNLOCK();
        if ((int)*plVar2 == 0) {
          *(undefined8 *)this = 0;
          (**(code **)(**(long **)(this + 8) + 0x10))();
        }
        LOCK();
        piVar1 = (int *)(*(long *)(this + 8) + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (*(long **)(this + 8) != (long *)0x0) {
            (**(code **)(**(long **)(this + 8) + 8))();
          }
          *(undefined8 *)(this + 8) = 0;
        }
      }
      *(TextureBinding **)this = pTVar5;
      *(long **)(this + 8) = plVar6;
      LOCK();
      *(int *)(plVar6 + 1) = (int)plVar6[1] + 1;
      UNLOCK();
      LOCK();
      *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
      UNLOCK();
    }
    LOCK();
    plVar2 = plVar6 + 1;
    *(int *)plVar2 = (int)*plVar2 + -1;
    UNLOCK();
    if ((int)*plVar2 == 0) {
      (**(code **)(*plVar6 + 0x10))(plVar6);
    }
    LOCK();
    piVar1 = (int *)((long)plVar6 + 0xc);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**(code **)(*plVar6 + 8))(plVar6);
    }
    de::details::UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::
    reset((UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_> *)&local_48
         );
    pSVar7 = extraout_RDX_06;
  }
  lVar3 = *(long *)this;
  *(int *)(lVar3 + 0x40) = lodBase;
  *(undefined8 *)(lVar3 + 0x44) = 0x400000003;
  *(undefined8 *)(lVar3 + 0x4c) = 0x600000005;
  *(undefined8 *)(lVar3 + 0x54) = 1;
  TVar9.m_state = pSVar7;
  TVar9.m_ptr = (TextureBinding *)this;
  return TVar9;
}

Assistant:

static TextureBindingSp createEmptyTexture (deUint32				format,
											TextureType				type,
											const tcu::IVec3&		textureSize,
											int						numLevels,
											int						lodBase,
											const tcu::Sampler&		sampler)
{
	const tcu::TextureFormat			texFmt				= glu::mapGLInternalFormat(format);
	const TextureBinding::Parameters	params				(lodBase);
	TextureBindingSp					textureBinding;

	switch (type)
	{

		case TEXTURETYPE_1D:
		{
			de::MovePtr<tcu::Texture1D>			texture		(new tcu::Texture1D(texFmt, textureSize.x()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_2D:
		{
			de::MovePtr<tcu::Texture2D>			texture		(new tcu::Texture2D(texFmt, textureSize.x(), textureSize.y()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_3D:
		{
			de::MovePtr<tcu::Texture3D>			texture		(new tcu::Texture3D(texFmt, textureSize.x(), textureSize.y(), textureSize.z()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_CUBE_MAP:
		{
			de::MovePtr<tcu::TextureCube>		texture		(new tcu::TextureCube(texFmt, textureSize.x()));

			for (int level = 0; level < numLevels; level++)
				for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
					texture->allocLevel((tcu::CubeFace)face, level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_1D_ARRAY:
		{
			de::MovePtr<tcu::Texture1DArray>	texture		(new tcu::Texture1DArray(texFmt, textureSize.x(), textureSize.z()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_2D_ARRAY:
		{
			de::MovePtr<tcu::Texture2DArray>	texture		(new tcu::Texture2DArray(texFmt, textureSize.x(), textureSize.y(), textureSize.z()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_CUBE_ARRAY:
		{
			de::MovePtr<tcu::TextureCubeArray>	texture		(new tcu::TextureCubeArray(texFmt, textureSize.x(), textureSize.z()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	textureBinding->setParameters(params);
	return textureBinding;
}